

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

Abc_Obj_t *
Sfm_DecInsert(Abc_Ntk_t *pNtk,Abc_Obj_t *pPivot,int Limit,Vec_Int_t *vGates,Vec_Wec_t *vFanins,
             Vec_Int_t *vMap,Vec_Ptr_t *vGateHandles,int GateBuf,int GateInv,Vec_Wrd_t *vFuncs,
             Vec_Int_t *vTimeNodes,Sfm_Mit_t *pMit)

{
  Vec_Int_t *pObj;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  int *piVar6;
  Abc_Obj_t *pAVar7;
  int t;
  int *pArray;
  int iGateNew;
  int iGate;
  int iFaninNew;
  int iFanin;
  Abc_Obj_t *pFanout;
  int Gate;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Abc_Obj_t *pObjNew;
  Vec_Int_t *vMap_local;
  Vec_Wec_t *vFanins_local;
  Vec_Int_t *vGates_local;
  Abc_Obj_t *pAStack_20;
  int Limit_local;
  Abc_Obj_t *pPivot_local;
  Abc_Ntk_t *pNtk_local;
  
  vLevel = (Vec_Int_t *)0x0;
  pObjNew = (Abc_Obj_t *)vMap;
  vMap_local = (Vec_Int_t *)vFanins;
  vFanins_local = (Vec_Wec_t *)vGates;
  vGates_local._4_4_ = Limit;
  pAStack_20 = pPivot;
  pPivot_local = (Abc_Obj_t *)pNtk;
  if (vTimeNodes != (Vec_Int_t *)0x0) {
    Vec_IntClear(vTimeNodes);
  }
  iVar2 = vGates_local._4_4_;
  iVar1 = Vec_IntSize((Vec_Int_t *)vFanins_local);
  iVar3 = vGates_local._4_4_;
  if (iVar1 <= iVar2) {
    __assert_fail("Limit < Vec_IntSize(vGates)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a4,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  iVar2 = Vec_IntSize((Vec_Int_t *)pObjNew);
  if (iVar3 != iVar2) {
    __assert_fail("Limit == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a5,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  iVar2 = vGates_local._4_4_ + 1;
  iVar3 = Vec_IntSize((Vec_Int_t *)vFanins_local);
  if (iVar2 == iVar3) {
    pFanout._0_4_ = Vec_IntEntryLast((Vec_Int_t *)vFanins_local);
    if ((int)pFanout == GateBuf) {
      pFanout._4_4_ = Vec_WecEntryEntry((Vec_Wec_t *)vMap_local,vGates_local._4_4_,0);
      pAVar7 = pPivot_local;
      iVar2 = Vec_IntEntry((Vec_Int_t *)pObjNew,pFanout._4_4_);
      vLevel = (Vec_Int_t *)Abc_NtkObj((Abc_Ntk_t *)pAVar7,iVar2);
      if (pMit != (Sfm_Mit_t *)0x0) {
        Sfm_MitTransferLoad(pMit,(Abc_Obj_t *)vLevel,pAStack_20);
      }
      Abc_ObjReplace(pAStack_20,(Abc_Obj_t *)vLevel);
      vLevel[1].nSize = vLevel[1].nSize & 0xfff;
      Abc_NtkUpdateIncLevel_rec((Abc_Obj_t *)vLevel);
      if (vTimeNodes != (Vec_Int_t *)0x0) {
        uVar4 = Abc_ObjId((Abc_Obj_t *)vLevel);
        Vec_IntPush(vTimeNodes,uVar4);
      }
      return (Abc_Obj_t *)vLevel;
    }
    if ((vTimeNodes == (Vec_Int_t *)0x0) && ((int)pFanout == GateInv)) {
      for (iObj = 0; iVar2 = iObj, iVar3 = Abc_ObjFanoutNum(pAStack_20), iVar2 < iVar3;
          iObj = iObj + 1) {
        _iFaninNew = Abc_ObjFanout(pAStack_20,iObj);
        iVar2 = Abc_ObjIsNode(_iFaninNew);
        if (iVar2 == 0) break;
        iVar2 = Mio_GateReadValue((Mio_Gate_t *)(_iFaninNew->field_5).pData);
        iVar3 = Abc_ObjFaninNum(_iFaninNew);
        iVar1 = Abc_NodeFindFanin(_iFaninNew,pAStack_20);
        iVar2 = Sfm_LibFindComplInputGate(vFuncs,iVar2,iVar3,iVar1,(int *)0x0);
        if (iVar2 == -1) break;
      }
      iVar2 = iObj;
      iVar3 = Abc_ObjFanoutNum(pAStack_20);
      if (iVar2 == iVar3) {
        iObj = 0;
        while( true ) {
          iVar2 = iObj;
          iVar3 = Abc_ObjFanoutNum(pAStack_20);
          if (iVar3 <= iVar2) {
            pFanout._4_4_ = Vec_WecEntryEntry((Vec_Wec_t *)vMap_local,vGates_local._4_4_,0);
            pAVar7 = pPivot_local;
            iVar2 = Vec_IntEntry((Vec_Int_t *)pObjNew,pFanout._4_4_);
            vLevel = (Vec_Int_t *)Abc_NtkObj((Abc_Ntk_t *)pAVar7,iVar2);
            Abc_ObjReplace(pAStack_20,(Abc_Obj_t *)vLevel);
            vLevel[1].nSize = vLevel[1].nSize & 0xfff;
            Abc_NtkUpdateIncLevel_rec((Abc_Obj_t *)vLevel);
            return (Abc_Obj_t *)vLevel;
          }
          _iFaninNew = Abc_ObjFanout(pAStack_20,iObj);
          iGate = Abc_NodeFindFanin(_iFaninNew,pAStack_20);
          iGateNew = -1;
          iVar2 = Mio_GateReadValue((Mio_Gate_t *)(_iFaninNew->field_5).pData);
          iVar3 = Abc_ObjFaninNum(_iFaninNew);
          iVar3 = Sfm_LibFindComplInputGate(vFuncs,iVar2,iVar3,iGate,&iGateNew);
          if (((iVar3 < 0) || (iVar3 == iVar2)) || (iGateNew < 0)) break;
          pvVar5 = Vec_PtrEntry(vGateHandles,iVar3);
          (_iFaninNew->field_5).pData = pvVar5;
          if (iGate != iGateNew) {
            piVar6 = Vec_IntArray(&_iFaninNew->vFanins);
            iVar2 = piVar6[iGate];
            piVar6[iGate] = piVar6[iGateNew];
            piVar6[iGateNew] = iVar2;
          }
          iObj = iObj + 1;
        }
        __assert_fail("iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x6c8,
                      "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                     );
      }
    }
  }
  iObj = vGates_local._4_4_;
  while( true ) {
    iVar2 = iObj;
    iVar3 = Vec_IntSize((Vec_Int_t *)vFanins_local);
    if (iVar3 <= iVar2) {
      if (pMit != (Sfm_Mit_t *)0x0) {
        Sfm_MitTimingGrow(pMit);
        Sfm_MitTransferLoad(pMit,(Abc_Obj_t *)vLevel,pAStack_20);
      }
      Abc_ObjReplace(pAStack_20,(Abc_Obj_t *)vLevel);
      for (iObj = vGates_local._4_4_; iVar2 = iObj, iVar3 = Vec_IntSize((Vec_Int_t *)pObjNew),
          pAVar7 = pPivot_local, iVar2 < iVar3; iObj = iObj + 1) {
        iVar2 = Vec_IntEntry((Vec_Int_t *)pObjNew,iObj);
        vLevel = (Vec_Int_t *)Abc_NtkObj((Abc_Ntk_t *)pAVar7,iVar2);
        if ((Abc_Obj_t *)vLevel != (Abc_Obj_t *)0x0) {
          Abc_NtkUpdateIncLevel_rec((Abc_Obj_t *)vLevel);
        }
      }
      return (Abc_Obj_t *)vLevel;
    }
    pFanout._0_4_ = Vec_IntEntry((Vec_Int_t *)vFanins_local,iObj);
    _k = Vec_WecEntry((Vec_Wec_t *)vMap_local,iObj);
    vLevel = (Vec_Int_t *)Abc_NtkCreateNode((Abc_Ntk_t *)pPivot_local);
    for (Gate = 0; iVar2 = Gate, iVar3 = Vec_IntSize(_k), iVar2 < iVar3; Gate = Gate + 1) {
      pFanout._4_4_ = Vec_IntEntry(_k,Gate);
      pAVar7 = pPivot_local;
      pObj = vLevel;
      iVar2 = Vec_IntEntry((Vec_Int_t *)pObjNew,pFanout._4_4_);
      pAVar7 = Abc_NtkObj((Abc_Ntk_t *)pAVar7,iVar2);
      Abc_ObjAddFanin((Abc_Obj_t *)pObj,pAVar7);
    }
    piVar6 = (int *)Vec_PtrEntry(vGateHandles,(int)pFanout);
    vLevel[3].pArray = piVar6;
    iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)vLevel);
    iVar3 = Mio_GateReadPinNum((Mio_Gate_t *)vLevel[3].pArray);
    pAVar7 = pObjNew;
    if (iVar2 != iVar3) break;
    uVar4 = Abc_ObjId((Abc_Obj_t *)vLevel);
    Vec_IntPush((Vec_Int_t *)pAVar7,uVar4);
    if (vTimeNodes != (Vec_Int_t *)0x0) {
      uVar4 = Abc_ObjId((Abc_Obj_t *)vLevel);
      Vec_IntPush(vTimeNodes,uVar4);
    }
    iObj = iObj + 1;
  }
  __assert_fail("Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                ,0x6e4,
                "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
               );
}

Assistant:

Abc_Obj_t * Sfm_DecInsert( Abc_Ntk_t * pNtk, Abc_Obj_t * pPivot, int Limit, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Ptr_t * vGateHandles, int GateBuf, int GateInv, Vec_Wrd_t * vFuncs, Vec_Int_t * vTimeNodes, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pObjNew = NULL; 
    Vec_Int_t * vLevel;
    int i, k, iObj, Gate;
    if ( vTimeNodes )
        Vec_IntClear( vTimeNodes );
    // assuming that new gates are appended at the end
    assert( Limit < Vec_IntSize(vGates) );
    assert( Limit == Vec_IntSize(vMap) );
    if ( Limit + 1 == Vec_IntSize(vGates) )
    {
        Gate = Vec_IntEntryLast(vGates);
        if ( Gate == GateBuf )
        {
            iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
            pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
            // transfer load
            if ( pMit )
                Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
            // replace logic cone
            Abc_ObjReplace( pPivot, pObjNew );
            // update level
            pObjNew->Level = 0;
            Abc_NtkUpdateIncLevel_rec( pObjNew );
            if ( vTimeNodes )
                Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
            return pObjNew;
        }
        else if ( vTimeNodes == NULL && Gate == GateInv )
        {
            // check if fanouts can be updated
            Abc_Obj_t * pFanout;
            Abc_ObjForEachFanout( pPivot, pFanout, i )
                if ( !Abc_ObjIsNode(pFanout) || Sfm_LibFindComplInputGate(vFuncs, Mio_GateReadValue((Mio_Gate_t*)pFanout->pData), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL) == -1 )
                    break;
            // update fanouts
            if ( i == Abc_ObjFanoutNum(pPivot) )
            {
                Abc_ObjForEachFanout( pPivot, pFanout, i )
                {
                    int iFanin = Abc_NodeFindFanin(pFanout, pPivot), iFaninNew = -1;
                    int iGate = Mio_GateReadValue((Mio_Gate_t*)pFanout->pData);
                    int iGateNew = Sfm_LibFindComplInputGate( vFuncs, iGate, Abc_ObjFaninNum(pFanout), iFanin, &iFaninNew );
                    assert( iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0 );
                    pFanout->pData = Vec_PtrEntry( vGateHandles, iGateNew );
                    //assert( iFanin == iFaninNew );
                    // swap fanins
                    if ( iFanin != iFaninNew )
                    {
                        int * pArray = Vec_IntArray( &pFanout->vFanins );
                        ABC_SWAP( int, pArray[iFanin], pArray[iFaninNew] );
                    }
                }
                iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
                pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
                Abc_ObjReplace( pPivot, pObjNew );
                // update level
                pObjNew->Level = 0;
                Abc_NtkUpdateIncLevel_rec( pObjNew );
                return pObjNew;
            }
        }
    }
    // introduce new gates
    Vec_IntForEachEntryStart( vGates, Gate, i, Limit )
    {
        vLevel = Vec_WecEntry( vFanins, i );
        pObjNew = Abc_NtkCreateNode( pNtk );
        Vec_IntForEachEntry( vLevel, iObj, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, iObj)) );
        pObjNew->pData = Vec_PtrEntry( vGateHandles, Gate );
        assert( Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData) );
        Vec_IntPush( vMap, Abc_ObjId(pObjNew) );
        if ( vTimeNodes )
            Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
    }
    // transfer load
    if ( pMit )
    {
        Sfm_MitTimingGrow( pMit );
        Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
    }
    // replace logic cone
    Abc_ObjReplace( pPivot, pObjNew );
    // update level
    Abc_NtkForEachObjVecStart( vMap, pNtk, pObjNew, i, Limit )
        Abc_NtkUpdateIncLevel_rec( pObjNew );
    return pObjNew;
}